

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O0

void __thiscall streams_tests::streams_buffered_file::test_method(streams_buffered_file *this)

{
  long lVar1;
  bool bVar2;
  FILE *__stream;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffea28;
  __native_type *in_stack_ffffffffffffea30;
  char *in_stack_ffffffffffffea38;
  BufferedFile *in_stack_ffffffffffffea40;
  undefined7 in_stack_ffffffffffffea50;
  undefined1 in_stack_ffffffffffffea57;
  lazy_ostream *in_stack_ffffffffffffea58;
  const_string *in_stack_ffffffffffffea60;
  FILE *in_stack_ffffffffffffea68;
  unit_test_log_t *this_00;
  undefined7 in_stack_ffffffffffffea70;
  undefined1 in_stack_ffffffffffffea77;
  uint64_t in_stack_ffffffffffffea78;
  undefined7 in_stack_ffffffffffffea80;
  undefined1 in_stack_ffffffffffffea87;
  AutoFile *in_stack_ffffffffffffea88;
  undefined7 in_stack_ffffffffffffea90;
  undefined1 in_stack_ffffffffffffea97;
  undefined8 in_stack_ffffffffffffeaa0;
  AutoFile *in_stack_ffffffffffffeaa8;
  undefined7 in_stack_ffffffffffffeae8;
  undefined1 in_stack_ffffffffffffeaef;
  exception *e_2;
  uint8_t j_2;
  exception *e_1;
  exception *e;
  streams_buffered_file *this_local;
  const_string local_1108 [2];
  undefined1 local_10e8 [88];
  const_string local_1090 [2];
  lazy_ostream local_1070 [2];
  assertion_result local_1050 [2];
  __native_type local_1014 [2];
  __native_type local_fb4 [2];
  const_string local_f60 [2];
  lazy_ostream local_f40 [2];
  assertion_result local_f20 [2];
  __native_type local_ee4 [2];
  const_string local_e88 [2];
  lazy_ostream local_e68 [2];
  assertion_result local_e48 [7];
  const_string local_d98 [2];
  lazy_ostream local_d78 [2];
  assertion_result local_d58 [2];
  __native_type local_d1c [2];
  __native_type local_cbc [2];
  const_string local_c68 [2];
  lazy_ostream local_c48 [2];
  assertion_result local_c28 [2];
  __native_type local_bec [2];
  __native_type local_b94 [2];
  const_string local_b38 [2];
  lazy_ostream local_b18 [2];
  assertion_result local_af8 [2];
  __native_type local_abc [2];
  __native_type local_a5c [2];
  const_string local_a08 [2];
  lazy_ostream local_9e8 [2];
  assertion_result local_9c8 [2];
  __native_type local_98c [2];
  __native_type local_934 [2];
  const_string local_8d8 [2];
  lazy_ostream local_8b8 [2];
  assertion_result local_898 [2];
  __native_type local_85c [2];
  undefined1 local_800 [16];
  undefined1 local_7f0 [67];
  uint8_t j_1;
  __native_type local_7ac [2];
  const_string local_750 [2];
  lazy_ostream local_730 [2];
  assertion_result local_710 [7];
  const_string local_660 [2];
  lazy_ostream local_640 [2];
  assertion_result local_620 [2];
  const_string local_5e8 [2];
  lazy_ostream local_5c8 [2];
  assertion_result local_5a8 [2];
  __native_type local_56c [2];
  const_string local_518 [2];
  lazy_ostream local_4f8 [2];
  assertion_result local_4d8 [2];
  __native_type local_49c [2];
  const_string local_448 [2];
  lazy_ostream local_428 [2];
  assertion_result local_408 [2];
  __native_type local_3cc [2];
  __native_type local_36c [2];
  __native_type local_314 [2];
  uint8_t i;
  const_string local_2b8 [2];
  lazy_ostream local_298 [2];
  assertion_result local_278 [2];
  BufferedFile bf;
  const_string local_188 [2];
  lazy_ostream local_168 [2];
  assertion_result local_148 [2];
  BufferedFile bfbad;
  uint8_t j;
  AutoFile file;
  uint8_t a [29];
  path streams_test_filename;
  
  local_1014[0]._20_8_ = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((ArgsManager *)&in_stack_ffffffffffffea30->__data);
  fs::operator/((path *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  fs::path::~path((path *)in_stack_ffffffffffffea28);
  fsbridge::fopen((char *)&streams_test_filename,"w+b");
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffea28);
  AutoFile::AutoFile((AutoFile *)CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                     in_stack_ffffffffffffea68,
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffea60);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffea38);
  for (j = '\0'; j < 0x28; j = j + '\x01') {
    AutoFile::operator<<
              ((AutoFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size);
  }
  AutoFile::seek(in_stack_ffffffffffffeaa8,
                 CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
                 (int)((ulong)in_stack_ffffffffffffeaa0 >> 0x20));
  BufferedFile::BufferedFile
            ((BufferedFile *)CONCAT17(in_stack_ffffffffffffea97,in_stack_ffffffffffffea90),
             in_stack_ffffffffffffea88,CONCAT17(in_stack_ffffffffffffea87,in_stack_ffffffffffffea80)
             ,in_stack_ffffffffffffea78);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_148,local_168,local_188,0x10e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::~BufferedFile((BufferedFile *)in_stack_ffffffffffffea28);
  BufferedFile::BufferedFile
            ((BufferedFile *)CONCAT17(in_stack_ffffffffffffea97,in_stack_ffffffffffffea90),
             in_stack_ffffffffffffea88,CONCAT17(in_stack_ffffffffffffea87,in_stack_ffffffffffffea80)
             ,in_stack_ffffffffffffea78);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    BufferedFile::eof((BufferedFile *)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_278,local_298,local_2b8,0x116,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::operator>>
            ((BufferedFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_314[0].__data.__lock = 0;
    in_stack_ffffffffffffea38 = "0";
    in_stack_ffffffffffffea30 = local_314;
    in_stack_ffffffffffffea28 = "i";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (&local_314[0].__data.__spins,&local_314[0].__data.__count,0x11a,1,2,&i);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::operator>>
            ((BufferedFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_36c[0].__data.__lock = 1;
    in_stack_ffffffffffffea38 = "1";
    in_stack_ffffffffffffea30 = local_36c;
    in_stack_ffffffffffffea28 = "i";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (&local_36c[0].__data.__spins,&local_36c[0].__data.__count,0x11c,1,2,&i);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_3cc[0]._4_8_ = BufferedFile::GetPos((BufferedFile *)in_stack_ffffffffffffea28);
    local_3cc[0].__data.__lock = 2;
    in_stack_ffffffffffffea38 = "2U";
    in_stack_ffffffffffffea30 = local_3cc;
    in_stack_ffffffffffffea28 = "bf.GetPos()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_3cc[0].__data.__list.__prev + 4),
               &local_3cc[0].__data.__nusers,0x11f,1,2,&local_3cc[0].__data.__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    BufferedFile::SetPos(in_stack_ffffffffffffea40,(uint64_t)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_408,local_428,local_448,0x122,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::operator>>
            ((BufferedFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_49c[0].__data.__lock = 0;
    in_stack_ffffffffffffea38 = "0";
    in_stack_ffffffffffffea30 = local_49c;
    in_stack_ffffffffffffea28 = "i";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (&local_49c[0].__data.__spins,&local_49c[0].__data.__count,0x124,1,2,&i);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    BufferedFile::SetPos(in_stack_ffffffffffffea40,(uint64_t)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4d8,local_4f8,local_518,0x127,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::operator>>
            ((BufferedFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_56c[0].__data.__lock = 2;
    in_stack_ffffffffffffea38 = "2";
    in_stack_ffffffffffffea30 = local_56c;
    in_stack_ffffffffffffea28 = "i";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (&local_56c[0].__data.__spins,&local_56c[0].__data.__count,0x129,1,2,&i);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    BufferedFile::SetLimit(in_stack_ffffffffffffea40,(uint64_t)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5a8,local_5c8,local_5e8,0x12f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::operator>>
            ((BufferedFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_620,local_640,local_660,0x132,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    std::numeric_limits<unsigned_long>::max();
    BufferedFile::SetLimit(in_stack_ffffffffffffea40,(uint64_t)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_710,local_730,local_750,0x138,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_7ac[0]._4_8_ = BufferedFile::GetPos((BufferedFile *)in_stack_ffffffffffffea28);
    local_7ac[0].__data.__lock = 3;
    in_stack_ffffffffffffea38 = "3U";
    in_stack_ffffffffffffea30 = local_7ac;
    in_stack_ffffffffffffea28 = "bf.GetPos()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_7ac[0].__data.__list.__prev + 4),
               &local_7ac[0].__data.__nusers,0x13a,1,2,&local_7ac[0].__data.__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  for (j_1 = '\x03'; j_1 < 10; j_1 = j_1 + '\x01') {
    BufferedFile::operator>>
              ((BufferedFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size)
    ;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
                 in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
                 (size_t)in_stack_ffffffffffffea58,
                 (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
                 (char (*) [1])in_stack_ffffffffffffea28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
                 in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
      in_stack_ffffffffffffea38 = "j";
      in_stack_ffffffffffffea30 = (__native_type *)&j_1;
      in_stack_ffffffffffffea28 = "i";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_char>
                (local_7f0,local_800,0x13f,1,2,&i);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffea28);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_85c[0]._4_8_ = BufferedFile::GetPos((BufferedFile *)in_stack_ffffffffffffea28);
    local_85c[0].__data.__lock = 10;
    in_stack_ffffffffffffea38 = "10U";
    in_stack_ffffffffffffea30 = local_85c;
    in_stack_ffffffffffffea28 = "bf.GetPos()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_85c[0].__data.__list.__prev + 4),
               &local_85c[0].__data.__nusers,0x141,1,2,&local_85c[0].__data.__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    BufferedFile::SetPos(in_stack_ffffffffffffea40,(uint64_t)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_898,local_8b8,local_8d8,0x144,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_934[0]._4_8_ = BufferedFile::GetPos((BufferedFile *)in_stack_ffffffffffffea28);
    local_934[0].__data.__lock = 0;
    in_stack_ffffffffffffea38 = "0U";
    in_stack_ffffffffffffea30 = local_934;
    in_stack_ffffffffffffea28 = "bf.GetPos()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_934[0].__data.__list.__prev + 4),
               &local_934[0].__data.__nusers,0x145,1,2,&local_934[0].__data.__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::operator>>
            ((BufferedFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_98c[0].__data.__lock = 0;
    in_stack_ffffffffffffea38 = "0";
    in_stack_ffffffffffffea30 = local_98c;
    in_stack_ffffffffffffea28 = "i";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (&local_98c[0].__data.__spins,&local_98c[0].__data.__count,0x147,1,2,&i);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    BufferedFile::SetPos(in_stack_ffffffffffffea40,(uint64_t)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9c8,local_9e8,local_a08,0x14c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::operator>>
            ((BufferedFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_a5c[0].__data.__lock = 10;
    in_stack_ffffffffffffea38 = "10";
    in_stack_ffffffffffffea30 = local_a5c;
    in_stack_ffffffffffffea28 = "i";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (&local_a5c[0].__data.__spins,&local_a5c[0].__data.__count,0x14e,1,2,&i);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_abc[0]._4_8_ = BufferedFile::GetPos((BufferedFile *)in_stack_ffffffffffffea28);
    local_abc[0].__data.__lock = 0xb;
    in_stack_ffffffffffffea38 = "11U";
    in_stack_ffffffffffffea30 = local_abc;
    in_stack_ffffffffffffea28 = "bf.GetPos()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_abc[0].__data.__list.__prev + 4),
               &local_abc[0].__data.__nusers,0x14f,1,2,&local_abc[0].__data.__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    BufferedFile::SetPos(in_stack_ffffffffffffea40,(uint64_t)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_af8,local_b18,local_b38,0x153,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_b94[0]._4_8_ = BufferedFile::GetPos((BufferedFile *)in_stack_ffffffffffffea28);
    local_b94[0].__data.__lock = 1;
    in_stack_ffffffffffffea38 = "1U";
    in_stack_ffffffffffffea30 = local_b94;
    in_stack_ffffffffffffea28 = "bf.GetPos()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_b94[0].__data.__list.__prev + 4),
               &local_b94[0].__data.__nusers,0x154,1,2,&local_b94[0].__data.__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::operator>>
            ((BufferedFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_bec[0].__data.__lock = 1;
    in_stack_ffffffffffffea38 = "1";
    in_stack_ffffffffffffea30 = local_bec;
    in_stack_ffffffffffffea28 = "i";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (&local_bec[0].__data.__spins,&local_bec[0].__data.__count,0x156,1,2,&i);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    BufferedFile::SetPos(in_stack_ffffffffffffea40,(uint64_t)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c28,local_c48,local_c68,0x15a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::operator>>
            ((BufferedFile *)in_stack_ffffffffffffea38,(uchar (*) [29])in_stack_ffffffffffffea30);
  for (j_2 = '\0'; j_2 < 0x1d; j_2 = j_2 + '\x01') {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
                 in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
                 (size_t)in_stack_ffffffffffffea58,
                 (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
                 (char (*) [1])in_stack_ffffffffffffea28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
                 in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
      local_cbc[0]._0_4_ = j_2 + 0xb;
      in_stack_ffffffffffffea38 = "11 + j";
      in_stack_ffffffffffffea30 = local_cbc;
      in_stack_ffffffffffffea28 = "a[j]";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
                (&local_cbc[0].__data.__spins,&local_cbc[0].__data.__count,0x15f,1,2,a + (uint)j_2);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffea28);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_d1c[0]._4_8_ = BufferedFile::GetPos((BufferedFile *)in_stack_ffffffffffffea28);
    local_d1c[0].__data.__lock = 0x28;
    in_stack_ffffffffffffea38 = "40U";
    in_stack_ffffffffffffea30 = local_d1c;
    in_stack_ffffffffffffea28 = "bf.GetPos()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_d1c[0].__data.__list.__prev + 4),
               &local_d1c[0].__data.__nusers,0x162,1,2,&local_d1c[0].__data.__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::operator>>
            ((BufferedFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d58,local_d78,local_d98,0x167,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    BufferedFile::eof((BufferedFile *)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e48,local_e68,local_e88,0x16d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_ee4[0]._4_8_ = BufferedFile::GetPos((BufferedFile *)in_stack_ffffffffffffea28);
    local_ee4[0].__data.__lock = 0x28;
    in_stack_ffffffffffffea38 = "40U";
    in_stack_ffffffffffffea30 = local_ee4;
    in_stack_ffffffffffffea28 = "bf.GetPos()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_ee4[0].__data.__list.__prev + 4),
               &local_ee4[0].__data.__nusers,0x170,1,2,&local_ee4[0].__data.__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    BufferedFile::SetPos(in_stack_ffffffffffffea40,(uint64_t)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f20,local_f40,local_f60,0x171,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  BufferedFile::operator>>
            ((BufferedFile *)in_stack_ffffffffffffea38,(uchar *)in_stack_ffffffffffffea30->__size);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_fb4[0].__data.__lock = 0x1e;
    in_stack_ffffffffffffea38 = "30";
    in_stack_ffffffffffffea30 = local_fb4;
    in_stack_ffffffffffffea28 = "i";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (&local_fb4[0].__data.__spins,&local_fb4[0].__data.__count,0x173,1,2,&i);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (char (*) [1])in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    local_1014[0]._4_8_ = BufferedFile::GetPos((BufferedFile *)in_stack_ffffffffffffea28);
    local_1014[0].__data.__lock = 0x1f;
    in_stack_ffffffffffffea38 = "31U";
    in_stack_ffffffffffffea30 = local_1014;
    in_stack_ffffffffffffea28 = "bf.GetPos()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_1014[0].__data.__list.__prev + 4),
               &local_1014[0].__data.__nusers,0x174,1,2,&local_1014[0].__data.__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,
               (size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    BufferedFile::SetPos(in_stack_ffffffffffffea40,(uint64_t)in_stack_ffffffffffffea38);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1050,local_1070,local_1090,0x177,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,in_stack_ffffffffffffea60,(size_t)in_stack_ffffffffffffea58,
               (const_string *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50));
    in_stack_ffffffffffffea60 =
         (const_string *)BufferedFile::GetPos((BufferedFile *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffea38,
               SUB81((ulong)in_stack_ffffffffffffea30 >> 0x38,0));
    in_stack_ffffffffffffea58 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffea30->__data,
               (basic_cstring<const_char> *)in_stack_ffffffffffffea28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffea38,
               in_stack_ffffffffffffea30->__size,(unsigned_long)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea28 = (char *)0x0;
    __stream = (FILE *)local_10e8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_10e8 + 0x20),(lazy_ostream *)__stream,local_1108,0x17a,
               CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffea28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffea28);
    in_stack_ffffffffffffea57 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffea57);
  AutoFile::fclose(&file,__stream);
  std::filesystem::remove(&streams_test_filename.super_path);
  BufferedFile::~BufferedFile((BufferedFile *)in_stack_ffffffffffffea28);
  AutoFile::~AutoFile((AutoFile *)in_stack_ffffffffffffea28);
  fs::path::~path((path *)in_stack_ffffffffffffea28);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_buffered_file)
{
    fs::path streams_test_filename = m_args.GetDataDirBase() / "streams_test_tmp";
    AutoFile file{fsbridge::fopen(streams_test_filename, "w+b")};

    // The value at each offset is the offset.
    for (uint8_t j = 0; j < 40; ++j) {
        file << j;
    }
    file.seek(0, SEEK_SET);

    // The buffer size (second arg) must be greater than the rewind
    // amount (third arg).
    try {
        BufferedFile bfbad{file, 25, 25};
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                        "Rewind limit must be less than buffer size") != nullptr);
    }

    // The buffer is 25 bytes, allow rewinding 10 bytes.
    BufferedFile bf{file, 25, 10};
    BOOST_CHECK(!bf.eof());

    uint8_t i;
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    // After reading bytes 0 and 1, we're positioned at 2.
    BOOST_CHECK_EQUAL(bf.GetPos(), 2U);

    // Rewind to offset 0, ok (within the 10 byte window).
    BOOST_CHECK(bf.SetPos(0));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);

    // We can go forward to where we've been, but beyond may fail.
    BOOST_CHECK(bf.SetPos(2));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 2);

    // If you know the maximum number of bytes that should be
    // read to deserialize the variable, you can limit the read
    // extent. The current file offset is 3, so the following
    // SetLimit() allows zero bytes to be read.
    BOOST_CHECK(bf.SetLimit(3));
    try {
        bf >> i;
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                           "Attempt to position past buffer limit") != nullptr);
    }
    // The default argument removes the limit completely.
    BOOST_CHECK(bf.SetLimit());
    // The read position should still be at 3 (no change).
    BOOST_CHECK_EQUAL(bf.GetPos(), 3U);

    // Read from current offset, 3, forward until position 10.
    for (uint8_t j = 3; j < 10; ++j) {
        bf >> i;
        BOOST_CHECK_EQUAL(i, j);
    }
    BOOST_CHECK_EQUAL(bf.GetPos(), 10U);

    // We're guaranteed (just barely) to be able to rewind to zero.
    BOOST_CHECK(bf.SetPos(0));
    BOOST_CHECK_EQUAL(bf.GetPos(), 0U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);

    // We can set the position forward again up to the farthest
    // into the stream we've been, but no farther. (Attempting
    // to go farther may succeed, but it's not guaranteed.)
    BOOST_CHECK(bf.SetPos(10));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 10);
    BOOST_CHECK_EQUAL(bf.GetPos(), 11U);

    // Now it's only guaranteed that we can rewind to offset 1
    // (current read position, 11, minus rewind amount, 10).
    BOOST_CHECK(bf.SetPos(1));
    BOOST_CHECK_EQUAL(bf.GetPos(), 1U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    // We can stream into large variables, even larger than
    // the buffer size.
    BOOST_CHECK(bf.SetPos(11));
    {
        uint8_t a[40 - 11];
        bf >> a;
        for (uint8_t j = 0; j < sizeof(a); ++j) {
            BOOST_CHECK_EQUAL(a[j], 11 + j);
        }
    }
    BOOST_CHECK_EQUAL(bf.GetPos(), 40U);

    // We've read the entire file, the next read should throw.
    try {
        bf >> i;
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                        "BufferedFile::Fill: end of file") != nullptr);
    }
    // Attempting to read beyond the end sets the EOF indicator.
    BOOST_CHECK(bf.eof());

    // Still at offset 40, we can go back 10, to 30.
    BOOST_CHECK_EQUAL(bf.GetPos(), 40U);
    BOOST_CHECK(bf.SetPos(30));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 30);
    BOOST_CHECK_EQUAL(bf.GetPos(), 31U);

    // We're too far to rewind to position zero.
    BOOST_CHECK(!bf.SetPos(0));
    // But we should now be positioned at least as far back as allowed
    // by the rewind window (relative to our farthest read position, 40).
    BOOST_CHECK(bf.GetPos() <= 30U);

    // We can explicitly close the file, or the destructor will do it.
    file.fclose();

    fs::remove(streams_test_filename);
}